

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void * __thiscall
Rml::Detail::BasicStackAllocator::allocate
          (BasicStackAllocator *this,size_t alignment,size_t byte_size)

{
  void **ptr;
  void *pvVar1;
  size_t available_space;
  byte *local_18;
  
  ptr = &this->p;
  local_18 = this->data + (this->N - (long)this->p);
  pvVar1 = rmlui_align(alignment,byte_size,ptr,(size_t *)&local_18);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = malloc(byte_size);
  }
  else {
    pvVar1 = *ptr;
    *ptr = (void *)(byte_size + (long)pvVar1);
  }
  return pvVar1;
}

Assistant:

void* BasicStackAllocator::allocate(size_t alignment, size_t byte_size)
	{
		size_t available_space = N - ((byte*)p - data);

		if (rmlui_align(alignment, byte_size, p, available_space))
		{
			void* result = p;
			p = (byte*)p + byte_size;
			return result;
		}

		// Fall back to malloc
		return malloc(byte_size);
	}